

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
fasttext::FastText::selectEmbeddings(FastText *this,int32_t cutoff)

{
  string_view w;
  anon_class_16_2_b239f476 __comp;
  int32_t iVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  vector<int,_std::allocator<int>_> *this_00;
  element_type *this_01;
  undefined8 in_RSI;
  const_iterator in_RDI;
  int32_t eosid;
  Vector norms;
  shared_ptr<fasttext::DenseMatrix> input;
  vector<int,_std::allocator<int>_> *idx;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffee8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  DenseMatrix *in_stack_ffffffffffffff00;
  Dictionary *this_02;
  shared_ptr<fasttext::Matrix> *in_stack_ffffffffffffff08;
  const_iterator __first_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  undefined4 local_4c;
  undefined1 local_45;
  
  __last._M_current = (int *)&stack0xffffffffffffffd8;
  __first_00._M_current = in_RDI._M_current;
  std::dynamic_pointer_cast<fasttext::DenseMatrix,fasttext::Matrix>(in_stack_ffffffffffffff08);
  std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x1be728);
  __first._M_current =
       (int *)Matrix::size((Matrix *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           in_stack_fffffffffffffef0._M_current);
  Vector::Vector((Vector *)in_stack_fffffffffffffef0._M_current,
                 (int64_t)in_stack_fffffffffffffee8._M_current);
  std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x1be75c);
  DenseMatrix::l2NormRow
            (in_stack_ffffffffffffff00,
             (Vector *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_45 = 0;
  std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x1be783);
  this_00 = (vector<int,_std::allocator<int>_> *)
            Matrix::size((Matrix *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (int64_t)in_stack_fffffffffffffef0._M_current);
  local_4c = 0;
  this_02 = (Dictionary *)&stack0xffffffffffffffb3;
  std::allocator<int>::allocator((allocator<int> *)0x1be7b3);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RDI._M_current,(size_type)this_00,
             (value_type_conflict1 *)this_02,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::allocator<int>::~allocator((allocator<int> *)0x1be7de);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0);
  this_01 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1be829);
  std::__cxx11::string::operator_cast_to_basic_string_view((string *)Dictionary::EOS_abi_cxx11_);
  w._M_str = (char *)in_RDI._M_current;
  w._M_len = (size_t)this_00;
  iVar1 = Dictionary::getId(this_02,w);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8._M_current);
  __comp._8_8_ = in_RSI;
  __comp.norms = (Vector *)__first_00._M_current;
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,fasttext::FastText::selectEmbeddings(int)const::__0>
            (__first,__last,__comp);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8._M_current);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffffef8),(difference_type)this_01);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffee8._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8._M_current);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffee8._M_current);
  std::vector<int,_std::allocator<int>_>::erase(this_00,__first_00,in_RDI);
  local_45 = 1;
  Vector::~Vector((Vector *)0x1be9f0);
  std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x1be9fd)
  ;
  return (vector<int,_std::allocator<int>_> *)__first_00._M_current;
}

Assistant:

std::vector<int32_t> FastText::selectEmbeddings(int32_t cutoff) const {
  std::shared_ptr<DenseMatrix> input =
      std::dynamic_pointer_cast<DenseMatrix>(input_);
  Vector norms(input->size(0));
  input->l2NormRow(norms);
  std::vector<int32_t> idx(input->size(0), 0);
  std::iota(idx.begin(), idx.end(), 0);
  auto eosid = dict_->getId(Dictionary::EOS);
  std::sort(idx.begin(), idx.end(), [&norms, eosid](size_t i1, size_t i2) {
    if (i1 == eosid && i2 == eosid) { // satisfy strict weak ordering
      return false;
    }
    return eosid == i1 || (eosid != i2 && norms[i1] > norms[i2]);
  });
  idx.erase(idx.begin() + cutoff, idx.end());
  return idx;
}